

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

bool __thiscall QMakeEvaluator::prepareProject(QMakeEvaluator *this,QString *inDir)

{
  int iVar1;
  QMakeGlobals *pQVar2;
  QArrayData *pQVar3;
  bool bVar4;
  Data *pDVar5;
  qsizetype qVar6;
  QString *pQVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char *pcVar10;
  char cVar11;
  bool bVar12;
  byte bVar13;
  char16_t *pcVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QFileInfo qdfi_1;
  QFileInfo qsdfi;
  QFileInfo qdfi;
  QFileInfo qdfi_2;
  undefined1 *local_118;
  QStringBuilder<QString_&,_QLatin1String> local_110;
  QString local_f8;
  QStringBuilder<QString_&,_QLatin1String> local_d8;
  QStringBuilder<QString_&,_QLatin1String> local_b8;
  QString local_98;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x0;
  pcStack_50 = (char16_t *)0x0;
  local_48 = (char *)0x0;
  pQVar2 = this->m_option;
  if (pQVar2->do_cache != true) goto LAB_0027df9c;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  local_98.d.d = (pQVar2->cachefile).d.d;
  local_98.d.ptr = (pQVar2->cachefile).d.ptr;
  local_98.d.size = (pQVar2->cachefile).d.size;
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((char *)local_98.d.size == (char *)0x0) {
    if ((this->m_outputDir).d.size != 0) {
      QString::operator=((QString *)&local_58,(QString *)&this->m_outputDir);
      do {
        local_b8.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.b.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.b.m_size = 0xd;
        local_d8.b.m_data = "/.qmake.super";
        local_d8.a = (QString *)&local_58;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_b8,&local_d8)
        ;
        bVar12 = QMakeVfs::exists(this->m_vfs,(QString *)&local_b8,(VfsFlags)0x0);
        if (bVar12) {
          QDir::cleanPath((QString *)&local_d8);
          pQVar3 = &((this->m_superfile).d.d)->super_QArrayData;
          pcVar14 = (this->m_superfile).d.ptr;
          (this->m_superfile).d.d = (Data *)local_d8.a;
          (this->m_superfile).d.ptr = (char16_t *)local_d8.b.m_size;
          pcVar15 = (char *)(this->m_superfile).d.size;
          (this->m_superfile).d.size = (qsizetype)local_d8.b.m_data;
          local_d8.a = (QString *)pQVar3;
          local_d8.b.m_size = (qsizetype)pcVar14;
          local_d8.b.m_data = pcVar15;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
          bVar13 = 0;
        }
        else {
          local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_f8,(QString *)&local_58);
          bVar13 = QFileInfo::isRoot();
          pQVar3 = local_58;
          if (bVar13 == 0) {
            QFileInfo::path();
            pcVar10 = local_48;
            pcVar14 = pcStack_50;
            pQVar3 = local_58;
            pcVar15 = local_d8.b.m_data;
            pQVar7 = local_d8.a;
            local_d8.a = (QString *)local_58;
            local_58 = (QArrayData *)pQVar7;
            pcStack_50 = (char16_t *)local_d8.b.m_size;
            local_d8.b.m_size = (qsizetype)pcVar14;
            local_d8.b.m_data = local_48;
            local_48 = pcVar15;
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&pQVar3->ref_)->d =
                   *(int *)&((DataPointer *)&pQVar3->ref_)->d + -1;
              iVar1 = *(int *)&((DataPointer *)&pQVar3->ref_)->d;
              UNLOCK();
              local_d8.a = (QString *)pQVar3;
              local_d8.b.m_data = pcVar10;
joined_r0x0027e3ea:
              if (iVar1 == 0) {
                QArrayData::deallocate(pQVar3,2,0x10);
              }
            }
          }
          else if (pcStack_50 != (char16_t *)0x0) {
            local_58 = (QArrayData *)0x0;
            pcStack_50 = (char16_t *)0x0;
            local_48 = (char *)0x0;
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&pQVar3->ref_)->d =
                   *(int *)&((DataPointer *)&pQVar3->ref_)->d + -1;
              iVar1 = *(int *)&((DataPointer *)&pQVar3->ref_)->d;
              UNLOCK();
              goto joined_r0x0027e3ea;
            }
          }
          bVar13 = bVar13 ^ 1;
          QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
        }
        if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
          }
        }
      } while (bVar13 != 0);
      local_b8.a = (QString *)(inDir->d).d;
      local_b8.b.m_size = (qsizetype)(inDir->d).ptr;
      local_b8.b.m_data = (char *)(inDir->d).size;
      if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_b8.a)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_b8.a)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_d8.a = (QString *)(this->m_outputDir).d.d;
      local_d8.b.m_size = (qsizetype)(this->m_outputDir).d.ptr;
      local_d8.b.m_data = (char *)(this->m_outputDir).d.size;
      if ((QArrayData *)local_d8.a != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_d8.a)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_d8.a)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      do {
        local_110.b.m_size = 0xc;
        local_110.b.m_data = "/.qmake.conf";
        local_110.a = (QString *)&local_b8;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_f8,&local_110);
        pcVar14 = local_78.d.ptr;
        pDVar9 = local_78.d.d;
        qVar6 = local_f8.d.size;
        pDVar5 = local_f8.d.d;
        local_f8.d.d = local_78.d.d;
        local_78.d.d = pDVar5;
        local_78.d.ptr = local_f8.d.ptr;
        local_f8.d.ptr = pcVar14;
        local_f8.d.size = local_78.d.size;
        local_78.d.size = qVar6;
        if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
          }
        }
        bVar12 = QMakeVfs::exists(this->m_vfs,&local_78,(VfsFlags)0x0);
        pDVar5 = local_78.d.d;
        if ((!bVar12) && (local_78.d.ptr != (char16_t *)0x0)) {
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = (char16_t *)0x0;
          local_78.d.size = 0;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
            }
          }
        }
        local_110.b.m_size = 0xd;
        local_110.b.m_data = "/.qmake.cache";
        local_110.a = (QString *)&local_d8;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_f8,&local_110);
        pcVar14 = local_98.d.ptr;
        pDVar9 = local_98.d.d;
        qVar6 = local_f8.d.size;
        pDVar5 = local_f8.d.d;
        local_f8.d.d = local_98.d.d;
        local_98.d.d = pDVar5;
        local_98.d.ptr = local_f8.d.ptr;
        local_f8.d.ptr = pcVar14;
        local_f8.d.size = local_98.d.size;
        local_98.d.size = qVar6;
        if (&pDVar9->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar9->super_QArrayData,2,0x10);
          }
        }
        bVar12 = QMakeVfs::exists(this->m_vfs,&local_98,(VfsFlags)0x0);
        pDVar5 = local_98.d.d;
        if ((!bVar12) && (local_98.d.ptr != (char16_t *)0x0)) {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
            }
          }
        }
        if (((char *)local_78.d.size != (char *)0x0) || ((char *)local_98.d.size != (char *)0x0)) {
          if ((local_d8.b.m_data != local_b8.b.m_data) ||
             (QVar18.m_data = (storage_type_conflict *)local_d8.b.m_size,
             QVar18.m_size = (qsizetype)local_d8.b.m_data,
             QVar21.m_data = (storage_type_conflict *)local_b8.b.m_size,
             QVar21.m_size = (qsizetype)local_b8.b.m_data,
             cVar11 = QtPrivate::equalStrings(QVar18,QVar21), cVar11 == '\0')) {
            QString::operator=(&this->m_sourceRoot,(QString *)&local_b8);
          }
          QString::operator=(&this->m_buildRoot,(QString *)&local_d8);
          bVar12 = false;
          break;
        }
        if ((local_d8.b.m_data == local_48) &&
           (QVar17.m_data = (storage_type_conflict *)local_d8.b.m_size,
           QVar17.m_size = (qsizetype)local_d8.b.m_data, QVar20.m_data = pcStack_50,
           QVar20.m_size = (qsizetype)local_48, cVar11 = QtPrivate::equalStrings(QVar17,QVar20),
           cVar11 != '\0')) {
          bVar12 = true;
          break;
        }
        local_110.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_110,(QString *)&local_b8);
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_118,(QString *)&local_d8);
        cVar11 = QFileInfo::isRoot();
        bVar12 = true;
        if ((cVar11 == '\0') && (cVar11 = QFileInfo::isRoot(), cVar11 == '\0')) {
          QFileInfo::path();
          qVar8 = local_b8.b.m_size;
          pQVar7 = local_b8.a;
          qVar6 = local_f8.d.size;
          pDVar5 = local_f8.d.d;
          local_f8.d.d = (Data *)local_b8.a;
          local_b8.a = (QString *)pDVar5;
          local_b8.b.m_size = (qsizetype)local_f8.d.ptr;
          local_f8.d.ptr = (char16_t *)qVar8;
          local_f8.d.size = (qsizetype)local_b8.b.m_data;
          local_b8.b.m_data = (char *)qVar6;
          if ((QArrayData *)pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar7,2,0x10);
            }
          }
          QFileInfo::path();
          qVar8 = local_d8.b.m_size;
          pQVar7 = local_d8.a;
          qVar6 = local_f8.d.size;
          pDVar5 = local_f8.d.d;
          local_f8.d.d = (Data *)local_d8.a;
          local_d8.a = (QString *)pDVar5;
          local_d8.b.m_size = (qsizetype)local_f8.d.ptr;
          local_f8.d.ptr = (char16_t *)qVar8;
          local_f8.d.size = (qsizetype)local_d8.b.m_data;
          local_d8.b.m_data = (char *)qVar6;
          if ((QArrayData *)pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar7,2,0x10);
            }
          }
          bVar12 = false;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_118);
        QFileInfo::~QFileInfo((QFileInfo *)&local_110);
      } while (bVar4);
      if ((QArrayData *)local_d8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_d8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_d8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_d8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8.a,2,0x10);
        }
      }
      if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
        }
      }
      if (!bVar12) goto LAB_0027de6b;
    }
  }
  else {
    QFileInfo::QFileInfo((QFileInfo *)&local_d8,(QString *)&local_98);
    QFileInfo::path();
    pQVar3 = &((this->m_buildRoot).d.d)->super_QArrayData;
    pcVar14 = (this->m_buildRoot).d.ptr;
    (this->m_buildRoot).d.d = (Data *)local_b8.a;
    (this->m_buildRoot).d.ptr = (char16_t *)local_b8.b.m_size;
    pcVar15 = (char *)(this->m_buildRoot).d.size;
    (this->m_buildRoot).d.size = (qsizetype)local_b8.b.m_data;
    local_b8.a = (QString *)pQVar3;
    local_b8.b.m_size = (qsizetype)pcVar14;
    local_b8.b.m_data = pcVar15;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_d8);
LAB_0027de6b:
    QDir::cleanPath((QString *)&local_b8);
    pQVar3 = &((this->m_conffile).d.d)->super_QArrayData;
    pcVar14 = (this->m_conffile).d.ptr;
    (this->m_conffile).d.d = (Data *)local_b8.a;
    (this->m_conffile).d.ptr = (char16_t *)local_b8.b.m_size;
    pcVar15 = (char *)(this->m_conffile).d.size;
    (this->m_conffile).d.size = (qsizetype)local_b8.b.m_data;
    local_b8.a = (QString *)pQVar3;
    local_b8.b.m_size = (qsizetype)pcVar14;
    local_b8.b.m_data = pcVar15;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QDir::cleanPath((QString *)&local_b8);
    pQVar3 = &((this->m_cachefile).d.d)->super_QArrayData;
    pcVar14 = (this->m_cachefile).d.ptr;
    *(undefined4 *)&(this->m_cachefile).d.d = local_b8.a._0_4_;
    *(undefined4 *)((long)&(this->m_cachefile).d.d + 4) = local_b8.a._4_4_;
    *(undefined4 *)&(this->m_cachefile).d.ptr = (undefined4)local_b8.b.m_size;
    *(undefined4 *)((long)&(this->m_cachefile).d.ptr + 4) = local_b8.b.m_size._4_4_;
    pcVar15 = (char *)(this->m_cachefile).d.size;
    (this->m_cachefile).d.size = (qsizetype)local_b8.b.m_data;
    local_b8.a = (QString *)pQVar3;
    local_b8.b.m_size = (qsizetype)pcVar14;
    local_b8.b.m_data = pcVar15;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0027df9c:
  local_78.d.d = (this->m_outputDir).d.d;
  local_78.d.ptr = (this->m_outputDir).d.ptr;
  local_78.d.size = (this->m_outputDir).d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  do {
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.b.m_size = 0xd;
    local_b8.b.m_data = "/.qmake.stash";
    local_b8.a = &local_78;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_98,&local_b8);
    pcVar15 = local_48;
    if (local_48 == (char *)0x0) {
      pcVar15 = (char *)(this->m_buildRoot).d.size;
    }
    if ((char *)local_78.d.size == pcVar15) {
      pcVar14 = (this->m_buildRoot).d.ptr;
      if (local_48 != (char *)0x0) {
        pcVar14 = pcStack_50;
      }
      QVar16.m_data = local_78.d.ptr;
      QVar16.m_size = local_78.d.size;
      QVar19.m_data = pcVar14;
      QVar19.m_size = (qsizetype)pcVar15;
      cVar11 = QtPrivate::equalStrings(QVar16,QVar19);
      if (cVar11 == '\0') goto LAB_0027e083;
LAB_0027e098:
      QDir::cleanPath((QString *)&local_b8);
      pQVar3 = &((this->m_stashfile).d.d)->super_QArrayData;
      pcVar14 = (this->m_stashfile).d.ptr;
      *(undefined4 *)&(this->m_stashfile).d.d = local_b8.a._0_4_;
      *(undefined4 *)((long)&(this->m_stashfile).d.d + 4) = local_b8.a._4_4_;
      *(undefined4 *)&(this->m_stashfile).d.ptr = (undefined4)local_b8.b.m_size;
      *(undefined4 *)((long)&(this->m_stashfile).d.ptr + 4) = local_b8.b.m_size._4_4_;
      pcVar15 = (char *)(this->m_stashfile).d.size;
      (this->m_stashfile).d.size = (qsizetype)local_b8.b.m_data;
      local_b8.a = (QString *)pQVar3;
      local_b8.b.m_size = (qsizetype)pcVar14;
      local_b8.b.m_data = pcVar15;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      bVar13 = 0;
    }
    else {
LAB_0027e083:
      bVar12 = QMakeVfs::exists(this->m_vfs,&local_98,(VfsFlags)0x0);
      if (bVar12) goto LAB_0027e098;
      local_d8.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_d8,(QString *)&local_78);
      bVar13 = QFileInfo::isRoot();
      if (bVar13 == 0) {
        QFileInfo::path();
        pcVar14 = local_78.d.ptr;
        pDVar5 = local_78.d.d;
        pcVar15 = local_b8.b.m_data;
        pQVar7 = local_b8.a;
        local_b8.a = (QString *)local_78.d.d;
        local_78.d.d = (Data *)pQVar7;
        local_78.d.ptr = (char16_t *)local_b8.b.m_size;
        local_b8.b.m_size = (qsizetype)pcVar14;
        local_b8.b.m_data = (char *)local_78.d.size;
        local_78.d.size = (qsizetype)pcVar15;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
          }
        }
      }
      bVar13 = bVar13 ^ 1;
      QFileInfo::~QFileInfo((QFileInfo *)&local_d8);
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar5 = local_78.d.d;
    if (bVar13 == 0) {
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = local_58;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&local_58->ref_)->d =
             *(int *)&((DataPointer *)&local_58->ref_)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&pQVar3->ref_)->d == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return true;
    }
  } while( true );
}

Assistant:

bool QMakeEvaluator::prepareProject(const QString &inDir)
{
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    QString superdir;
    if (m_option->do_cache) {
        QString conffile;
        QString cachefile = m_option->cachefile;
        if (cachefile.isEmpty())  { //find it as it has not been specified
            if (m_outputDir.isEmpty())
                goto no_cache;
            superdir = m_outputDir;
            forever {
                QString superfile = superdir + QLatin1String("/.qmake.super");
                if (m_vfs->exists(superfile, flags)) {
                    m_superfile = QDir::cleanPath(superfile);
                    break;
                }
                QFileInfo qdfi(superdir);
                if (qdfi.isRoot()) {
                    superdir.clear();
                    break;
                }
                superdir = qdfi.path();
            }
            QString sdir = inDir;
            QString dir = m_outputDir;
            forever {
                conffile = sdir + QLatin1String("/.qmake.conf");
                if (!m_vfs->exists(conffile, flags))
                    conffile.clear();
                cachefile = dir + QLatin1String("/.qmake.cache");
                if (!m_vfs->exists(cachefile, flags))
                    cachefile.clear();
                if (!conffile.isEmpty() || !cachefile.isEmpty()) {
                    if (dir != sdir)
                        m_sourceRoot = sdir;
                    m_buildRoot = dir;
                    break;
                }
                if (dir == superdir)
                    goto no_cache;
                QFileInfo qsdfi(sdir);
                QFileInfo qdfi(dir);
                if (qsdfi.isRoot() || qdfi.isRoot())
                    goto no_cache;
                sdir = qsdfi.path();
                dir = qdfi.path();
            }
        }